

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O3

string * __thiscall
iutest::TestSuite::testsuite_name_with_where_abi_cxx11_
          (string *__return_storage_ptr__,TestSuite *this)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_testsuite_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->m_testsuite_name)._M_string_length);
  iVar2 = (*this->_vptr_TestSuite[2])(this);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*this->_vptr_TestSuite[2])(this);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string testsuite_name_with_where() const
    {
        ::std::string str = m_testsuite_name;
        if( type_param() != NULL )
        {
            str += ", where TypeParam = ";
            str += type_param();
        }
        return str;
    }